

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O2

int cuddTimesInDeathRow(DdManager *dd,DdNode *f)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)dd->deathRowDepth;
  if (dd->deathRowDepth < 1) {
    uVar2 = uVar3;
  }
  iVar1 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = iVar1 + (uint)(dd->deathRow[uVar3] == f);
  }
  return iVar1;
}

Assistant:

int
cuddTimesInDeathRow(
  DdManager *dd,
  DdNode *f)
{
    int count = 0;
#ifndef DD_NO_DEATH_ROW
    int i;

    for (i = 0; i < dd->deathRowDepth; i++) {
        count += f == dd->deathRow[i];
    }
#endif

    return(count);

}